

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O0

UBool __thiscall icu_63::UVector32::operator==(UVector32 *this,UVector32 *other)

{
  int local_24;
  int32_t i;
  UVector32 *other_local;
  UVector32 *this_local;
  
  if (this->count == other->count) {
    for (local_24 = 0; local_24 < this->count; local_24 = local_24 + 1) {
      if (this->elements[local_24] != other->elements[local_24]) {
        return '\0';
      }
    }
    this_local._7_1_ = '\x01';
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool UVector32::operator==(const UVector32& other) {
    int32_t i;
    if (count != other.count) return FALSE;
    for (i=0; i<count; ++i) {
        if (elements[i] != other.elements[i]) {
            return FALSE;
        }
    }
    return TRUE;
}